

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_update_inter_mode_stats
               (FRAME_CONTEXT *fc,FRAME_COUNTS *counts,PREDICTION_MODE mode,int16_t mode_context)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  uint uVar4;
  aom_cdf_prob *paVar5;
  undefined7 in_register_00000011;
  ushort uVar6;
  aom_cdf_prob (*paaVar7) [3];
  
  uVar4 = (ushort)mode_context & 7;
  paaVar7 = fc->newmv_cdf + uVar4;
  uVar6 = fc->newmv_cdf[uVar4][2];
  bVar3 = (char)(uVar6 >> 4) + 4;
  uVar1 = (*paaVar7)[0];
  if ((int)CONCAT71(in_register_00000011,mode) == 0x10) {
    paVar5 = fc->newmv_cdf[uVar4] + 2;
    (*paaVar7)[0] = uVar1 - (uVar1 >> (bVar3 & 0x1f));
  }
  else {
    (*paaVar7)[0] = (short)((int)(0x8000 - (uint)uVar1) >> (bVar3 & 0x1f)) + uVar1;
    paVar5 = fc->newmv_cdf[uVar4] + 2;
    *paVar5 = *paVar5 + (ushort)(uVar6 < 0x20);
    uVar4 = (ushort)mode_context >> 3 & 1;
    paaVar7 = fc->zeromv_cdf + uVar4;
    uVar6 = fc->zeromv_cdf[uVar4][2];
    bVar3 = (char)(uVar6 >> 4) + 4;
    uVar1 = (*paaVar7)[0];
    if (mode == '\x0f') {
      paVar5 = fc->zeromv_cdf[uVar4] + 2;
      (*paaVar7)[0] = uVar1 - (uVar1 >> (bVar3 & 0x1f));
    }
    else {
      (*paaVar7)[0] = (short)((int)(0x8000 - (uint)uVar1) >> (bVar3 & 0x1f)) + uVar1;
      paVar5 = fc->zeromv_cdf[uVar4] + 2;
      *paVar5 = *paVar5 + (ushort)(uVar6 < 0x20);
      uVar4 = (ushort)mode_context >> 4 & 0xf;
      uVar6 = fc->refmv_cdf[uVar4][2];
      bVar3 = (char)(uVar6 >> 4) + 4;
      uVar1 = fc->refmv_cdf[uVar4][0];
      if (mode == '\r') {
        sVar2 = -(uVar1 >> (bVar3 & 0x1f));
      }
      else {
        sVar2 = (short)((int)(0x8000 - (uint)uVar1) >> (bVar3 & 0x1f));
      }
      paVar5 = fc->refmv_cdf[uVar4] + 2;
      fc->refmv_cdf[uVar4][0] = uVar1 + sVar2;
    }
  }
  *paVar5 = *paVar5 + (ushort)(uVar6 < 0x20);
  return;
}

Assistant:

void av1_update_inter_mode_stats(FRAME_CONTEXT *fc, FRAME_COUNTS *counts,
                                 PREDICTION_MODE mode, int16_t mode_context) {
  (void)counts;

  int16_t mode_ctx = mode_context & NEWMV_CTX_MASK;
  if (mode == NEWMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->newmv_mode[mode_ctx][0];
#endif
    update_cdf(fc->newmv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->newmv_mode[mode_ctx][1];
#endif
  update_cdf(fc->newmv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> GLOBALMV_OFFSET) & GLOBALMV_CTX_MASK;
  if (mode == GLOBALMV) {
#if CONFIG_ENTROPY_STATS
    ++counts->zeromv_mode[mode_ctx][0];
#endif
    update_cdf(fc->zeromv_cdf[mode_ctx], 0, 2);
    return;
  }

#if CONFIG_ENTROPY_STATS
  ++counts->zeromv_mode[mode_ctx][1];
#endif
  update_cdf(fc->zeromv_cdf[mode_ctx], 1, 2);

  mode_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;
#if CONFIG_ENTROPY_STATS
  ++counts->refmv_mode[mode_ctx][mode != NEARESTMV];
#endif
  update_cdf(fc->refmv_cdf[mode_ctx], mode != NEARESTMV, 2);
}